

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

LY_ERR lyd_diff_siblings_r(lyd_node *first,lyd_node *second,uint16_t options,ly_bool nosiblings,
                          lyd_node **diff)

{
  LY_ERR LVar1;
  lyd_node *plVar2;
  lyd_node *second_00;
  lyd_diff_userord *plVar3;
  lysc_node *plVar4;
  undefined7 in_register_00000009;
  uint64_t *puVar5;
  lyd_node **pplVar6;
  lyd_diff_op op_00;
  lyd_node **pplVar7;
  char *pcVar8;
  lys_module *plVar9;
  uint uVar10;
  lyd_node ***ppplVar11;
  lyd_diff_op op;
  char *orig_value;
  undefined4 local_a4;
  char *orig_default;
  lyd_node **local_98;
  char *orig_position;
  char *orig_key;
  char *position;
  char *key;
  lyd_node *match_second;
  lyd_diff_userord *userord;
  char *local_60;
  char *value;
  lyd_node *match_first;
  lyd_node *local_48;
  ly_ht *dup_inst_second;
  ly_ht *dup_inst_first;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000009,nosiblings);
  userord = (lyd_diff_userord *)0x0;
  dup_inst_first = (ly_ht *)0x0;
  dup_inst_second = (ly_ht *)0x0;
  uVar10 = (uint)options;
  local_98 = diff;
  local_48 = first;
  if (first != (lyd_node *)0x0) {
    do {
      if (first->schema != (lysc_node *)0x0) {
        if ((first->schema->flags & 0x100) != 0) {
          __assert_fail("!(iter_first->schema->flags & LYS_KEY)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                        ,0x3a9,
                        "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                       );
        }
        if (((options & 1) != 0) || ((first->flags & 1) == 0)) {
          LVar1 = lyd_diff_find_match(second,first,(byte)options & 1,&dup_inst_second,&match_second)
          ;
          if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
          plVar4 = first->schema;
          if (((plVar4 == (lysc_node *)0x0) || ((plVar4->nodetype & 0x18) == 0)) ||
             ((plVar4->flags & 0x40) == 0)) {
            LVar1 = lyd_diff_attrs(first,match_second,options,&op,&orig_default,&orig_value);
            if (LVar1 != LY_ENOT) {
              if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
              if (op == LYD_DIFF_OP_DELETE) {
                plVar2 = first;
                op_00 = LYD_DIFF_OP_DELETE;
              }
              else {
                plVar2 = match_second;
                op_00 = op;
                if (match_second == (lyd_node *)0x0) {
                  __assert_fail("match_second",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                                ,0x3d4,
                                "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                               );
                }
              }
              LVar1 = lyd_diff_add(plVar2,op_00,orig_default,orig_value,(char *)0x0,(char *)0x0,
                                   (char *)0x0,(char *)0x0,(char *)0x0,local_98);
              pcVar8 = orig_value;
LAB_001186ef:
              free(pcVar8);
              if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
            }
            if (match_second != (lyd_node *)0x0) goto LAB_00118704;
          }
          else {
            plVar3 = lyd_diff_userord_get(first,plVar4,&userord);
            if (plVar3 == (lyd_diff_userord *)0x0) {
              plVar4 = first->schema;
              if (plVar4 != (lysc_node *)0x0) goto LAB_00118b2a;
              plVar9 = (lys_module *)&first[2].schema;
              goto LAB_00118b37;
            }
            if (match_second == (lyd_node *)0x0) {
              LVar1 = lyd_diff_userord_attrs
                                (first,(lyd_node *)0x0,options,plVar3,&op,&orig_default,&value,
                                 &orig_value,&key,&orig_key,&position,&orig_position);
              if (LVar1 == LY_SUCCESS) {
                if (op != LYD_DIFF_OP_DELETE) {
                  __assert_fail("op == LYD_DIFF_OP_DELETE",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                                ,0x3bf,
                                "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                               );
                }
                local_60 = value;
                LVar1 = lyd_diff_add(first,LYD_DIFF_OP_DELETE,orig_default,orig_value,key,value,
                                     position,orig_key,orig_position,local_98);
                free(orig_value);
                free(key);
                free(local_60);
                free(position);
                free(orig_key);
                pcVar8 = orig_position;
                goto LAB_001186ef;
              }
              goto LAB_00118aa5;
            }
LAB_00118704:
            plVar2 = lyd_child_no_keys(first);
            second_00 = lyd_child_no_keys(match_second);
            LVar1 = lyd_diff_siblings_r(plVar2,second_00,options,'\0',local_98);
            if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
          }
          if ((char)local_a4 != '\0') break;
        }
      }
      first = first->next;
    } while (first != (lyd_node *)0x0);
  }
  puVar5 = &userord->pos;
  pplVar6 = (lyd_node **)0x0;
  while( true ) {
    if (userord == (lyd_diff_userord *)0x0) {
      pplVar7 = (lyd_node **)0x0;
    }
    else {
      pplVar7 = userord[-1].inst;
    }
    if (pplVar7 <= pplVar6) break;
    *puVar5 = 0;
    pplVar6 = (lyd_node **)((long)pplVar6 + 1);
    puVar5 = puVar5 + 3;
  }
  if (second != (lyd_node *)0x0) {
    do {
      if (second->schema != (lysc_node *)0x0) {
        if ((second->schema->flags & 0x100) != 0) {
          __assert_fail("!(iter_second->schema->flags & LYS_KEY)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                        ,0x3f7,
                        "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                       );
        }
        if (((options & 1) != 0) || ((second->flags & 1) == 0)) {
          LVar1 = lyd_diff_find_match(local_48,second,(byte)options & 1,&dup_inst_first,&match_first
                                     );
          if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
          plVar4 = second->schema;
          if (((plVar4 == (lysc_node *)0x0) || ((plVar4->nodetype & 0x18) == 0)) ||
             ((plVar4->flags & 0x40) == 0)) {
            if (match_first != (lyd_node *)0x0) {
LAB_001188f2:
              if ((char)local_a4 == '\0') goto LAB_00118a92;
              break;
            }
            LVar1 = lyd_diff_attrs((lyd_node *)0x0,second,(uint16_t)uVar10,&op,&orig_default,
                                   &orig_value);
            if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
            if (op != LYD_DIFF_OP_CREATE) {
              __assert_fail("op == LYD_DIFF_OP_CREATE",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                            ,0x420,
                            "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                           );
            }
            LVar1 = lyd_diff_add(second,LYD_DIFF_OP_CREATE,orig_default,orig_value,(char *)0x0,
                                 (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,local_98);
            free(orig_value);
            if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
          }
          else {
            plVar3 = lyd_diff_userord_get(match_first,plVar4,&userord);
            if (plVar3 == (lyd_diff_userord *)0x0) {
              plVar4 = second->schema;
              if (plVar4 == (lysc_node *)0x0) {
                plVar9 = (lys_module *)&second[2].schema;
              }
              else {
LAB_00118b2a:
                plVar9 = plVar4->module;
              }
LAB_00118b37:
              LVar1 = LY_EMEM;
              ly_log(plVar9->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lyd_diff_siblings_r");
              goto LAB_00118aa5;
            }
            LVar1 = lyd_diff_userord_attrs
                              (match_first,second,(uint16_t)uVar10,plVar3,&op,&orig_default,&value,
                               &orig_value,&key,&orig_key,&position,&orig_position);
            pcVar8 = value;
            if (LVar1 == LY_ENOT) goto LAB_001188f2;
            if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
            local_60 = (char *)CONCAT44(local_60._4_4_,uVar10);
            LVar1 = lyd_diff_add(second,op,orig_default,orig_value,key,value,position,orig_key,
                                 orig_position,local_98);
            free(orig_value);
            free(key);
            free(pcVar8);
            free(position);
            free(orig_key);
            free(orig_position);
            if (LVar1 != LY_SUCCESS) goto LAB_00118aa5;
            uVar10 = (uint)local_60;
          }
          if ((char)local_a4 != '\0') goto LAB_00118aa5;
        }
      }
LAB_00118a92:
      second = second->next;
    } while (second != (lyd_node *)0x0);
  }
  LVar1 = LY_SUCCESS;
LAB_00118aa5:
  lyd_dup_inst_free(dup_inst_first);
  lyd_dup_inst_free(dup_inst_second);
  if (userord != (lyd_diff_userord *)0x0) {
    plVar3 = userord + -1;
    if (userord[-1].inst != (lyd_node **)0x0) {
      ppplVar11 = &userord->inst;
      pplVar6 = (lyd_node **)0x0;
      do {
        if (*ppplVar11 != (lyd_node **)0x0) {
          free(*ppplVar11 + -1);
        }
        pplVar6 = (lyd_node **)((long)pplVar6 + 1);
        ppplVar11 = ppplVar11 + 3;
      } while (pplVar6 < plVar3->inst);
    }
    free(&plVar3->inst);
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyd_diff_siblings_r(const struct lyd_node *first, const struct lyd_node *second, uint16_t options, ly_bool nosiblings,
        struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    const struct lyd_node *iter_first, *iter_second;
    struct lyd_node *match_second, *match_first;
    struct lyd_diff_userord *userord = NULL, *userord_item;
    struct ly_ht *dup_inst_first = NULL, *dup_inst_second = NULL;
    LY_ARRAY_COUNT_TYPE u;
    enum lyd_diff_op op;
    const char *orig_default;
    char *orig_value, *key, *value, *position, *orig_key, *orig_position;

    /* compare first tree to the second tree - delete, replace, none */
    LY_LIST_FOR(first, iter_first) {
        if (!iter_first->schema) {
            continue;
        }

        assert(!(iter_first->schema->flags & LYS_KEY));
        if ((iter_first->flags & LYD_DEFAULT) && !(options & LYD_DIFF_DEFAULTS)) {
            /* skip default nodes */
            continue;
        }

        /* find a match in the second tree */
        LY_CHECK_GOTO(ret = lyd_diff_find_match(second, iter_first, options & LYD_DIFF_DEFAULTS, &dup_inst_second,
                &match_second), cleanup);

        if (lysc_is_userordered(iter_first->schema)) {
            /* get (create) userord entry */
            userord_item = lyd_diff_userord_get(iter_first, iter_first->schema, &userord);
            LY_CHECK_ERR_GOTO(!userord_item, LOGMEM(LYD_CTX(iter_first)); ret = LY_EMEM, cleanup);

            /* we are handling only user-ordered node delete now */
            if (!match_second) {
                /* get all the attributes */
                LY_CHECK_GOTO(ret = lyd_diff_userord_attrs(iter_first, match_second, options, userord_item, &op,
                        &orig_default, &value, &orig_value, &key, &orig_key, &position, &orig_position), cleanup);

                /* there must be changes, it is deleted */
                assert(op == LYD_DIFF_OP_DELETE);
                ret = lyd_diff_add(iter_first, op, orig_default, orig_value, key, value, position, orig_key,
                        orig_position, diff);

                free(orig_value);
                free(key);
                free(value);
                free(position);
                free(orig_key);
                free(orig_position);
                LY_CHECK_GOTO(ret, cleanup);
            }
        } else {
            /* get all the attributes */
            ret = lyd_diff_attrs(iter_first, match_second, options, &op, &orig_default, &orig_value);

            /* add into diff if there are any changes */
            if (!ret) {
                if (op == LYD_DIFF_OP_DELETE) {
                    ret = lyd_diff_add(iter_first, op, orig_default, orig_value, NULL, NULL, NULL, NULL, NULL, diff);
                } else {
                    assert(match_second);
                    ret = lyd_diff_add(match_second, op, orig_default, orig_value, NULL, NULL, NULL, NULL, NULL, diff);
                }

                free(orig_value);
                LY_CHECK_GOTO(ret, cleanup);
            } else if (ret == LY_ENOT) {
                ret = LY_SUCCESS;
            } else {
                goto cleanup;
            }
        }

        /* check descendants, if any, recursively */
        if (match_second) {
            LY_CHECK_GOTO(ret = lyd_diff_siblings_r(lyd_child_no_keys(iter_first), lyd_child_no_keys(match_second),
                    options, 0, diff), cleanup);
        }

        if (nosiblings) {
            break;
        }
    }

    /* reset all cached positions */
    LY_ARRAY_FOR(userord, u) {
        userord[u].pos = 0;
    }

    /* compare second tree to the first tree - create, user-ordered move */
    LY_LIST_FOR(second, iter_second) {
        if (!iter_second->schema) {
            continue;
        }

        assert(!(iter_second->schema->flags & LYS_KEY));
        if ((iter_second->flags & LYD_DEFAULT) && !(options & LYD_DIFF_DEFAULTS)) {
            /* skip default nodes */
            continue;
        }

        /* find a match in the first tree */
        LY_CHECK_GOTO(ret = lyd_diff_find_match(first, iter_second, options & LYD_DIFF_DEFAULTS, &dup_inst_first,
                &match_first), cleanup);

        if (lysc_is_userordered(iter_second->schema)) {
            /* get userord entry */
            userord_item = lyd_diff_userord_get(match_first, iter_second->schema, &userord);
            LY_CHECK_ERR_GOTO(!userord_item, LOGMEM(LYD_CTX(iter_second)); ret = LY_EMEM, cleanup);

            /* get all the attributes */
            ret = lyd_diff_userord_attrs(match_first, iter_second, options, userord_item, &op, &orig_default,
                    &value, &orig_value, &key, &orig_key, &position, &orig_position);

            /* add into diff if there are any changes */
            if (!ret) {
                ret = lyd_diff_add(iter_second, op, orig_default, orig_value, key, value, position, orig_key,
                        orig_position, diff);

                free(orig_value);
                free(key);
                free(value);
                free(position);
                free(orig_key);
                free(orig_position);
                LY_CHECK_GOTO(ret, cleanup);
            } else if (ret == LY_ENOT) {
                ret = LY_SUCCESS;
            } else {
                goto cleanup;
            }
        } else if (!match_first) {
            /* get all the attributes */
            LY_CHECK_GOTO(ret = lyd_diff_attrs(match_first, iter_second, options, &op, &orig_default, &orig_value), cleanup);

            /* there must be changes, it is created */
            assert(op == LYD_DIFF_OP_CREATE);
            ret = lyd_diff_add(iter_second, op, orig_default, orig_value, NULL, NULL, NULL, NULL, NULL, diff);

            free(orig_value);
            LY_CHECK_GOTO(ret, cleanup);
        } /* else was handled */

        if (nosiblings) {
            break;
        }
    }

cleanup:
    lyd_dup_inst_free(dup_inst_first);
    lyd_dup_inst_free(dup_inst_second);
    LY_ARRAY_FOR(userord, u) {
        LY_ARRAY_FREE(userord[u].inst);
    }
    LY_ARRAY_FREE(userord);
    return ret;
}